

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  IStreamingReporter *pIVar3;
  SectionStats local_d0;
  byte local_31;
  undefined1 local_30 [7];
  bool missingAssertions;
  Counts assertions;
  SectionEndInfo *endInfo_local;
  RunContext *this_local;
  
  assertions.failedButOk = (size_t)endInfo;
  Counts::operator-((Counts *)local_30,&(this->m_totals).assertions,&endInfo->prevAssertions);
  local_31 = testForMissingAssertions(this,(Counts *)local_30);
  bVar1 = std::
          vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
          ::empty(&this->m_activeSections);
  if (!bVar1) {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(&this->m_activeSections);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[10])();
    std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::pop_back(&this->m_activeSections);
  }
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  SectionStats::SectionStats
            (&local_d0,(SectionInfo *)assertions.failedButOk,(Counts *)local_30,
             *(double *)(assertions.failedButOk + 0x80),(bool)(local_31 & 1));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,&local_d0);
  SectionStats::~SectionStats(&local_d0);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  return;
}

Assistant:

virtual void sectionEnded(SectionEndInfo const& endInfo) {
			Counts assertions = m_totals.assertions - endInfo.prevAssertions;
			bool missingAssertions = testForMissingAssertions(assertions);

			if (!m_activeSections.empty()) {
				m_activeSections.back()->close();
				m_activeSections.pop_back();
			}

			m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
			m_messages.clear();
		}